

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mix.cpp
# Opt level: O3

bool __thiscall Timidity::GF1Envelope::Recompute(GF1Envelope *this,Voice *v)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  
  bVar2 = (this->super_MinEnvelope).stage;
  uVar6 = (ulong)bVar2;
  if (uVar6 < 6) {
    iVar3 = this->volume;
    lVar7 = 0;
    do {
      if (((uVar6 + lVar7 == 3) && ((v->status & 4) == 0)) && ((v->sample->modes & 0x20) != 0)) {
        v->status = v->status | 2;
        this->increment = 0;
        (this->super_MinEnvelope).bUpdating = '\0';
        return false;
      }
      (this->super_MinEnvelope).stage = bVar2 + (char)lVar7 + '\x01';
      iVar4 = this->offset[uVar6 + lVar7];
      if (iVar3 != iVar4) {
        this->target = iVar4;
        iVar5 = this->rate[uVar6 + lVar7];
        this->increment = iVar5;
        if (iVar3 <= iVar4) {
          return false;
        }
        this->increment = -iVar5;
        return false;
      }
      lVar1 = uVar6 + lVar7;
      lVar7 = lVar7 + 1;
    } while (lVar1 != 5);
  }
  this->increment = 0;
  (this->super_MinEnvelope).bUpdating = '\0';
  v->status = v->status & 0xe9 | 4;
  return false;
}

Assistant:

bool GF1Envelope::Recompute(Voice *v)
{
	int newstage;

	newstage = stage;

	if (newstage > GF1_RELEASEC)
	{
		/* Envelope ran out. */
		increment = 0;
		bUpdating = false;
		v->status &= ~(VOICE_SUSTAINING | VOICE_LPE);
		v->status |= VOICE_RELEASING;
		/* play sampled release */
		return 0;
	}

	if (newstage == GF1_RELEASE && !(v->status & VOICE_RELEASING) && (v->sample->modes & PATCH_SUSTAIN))
	{
		v->status |= VOICE_SUSTAINING;
		/* Freeze envelope until note turns off. Trumpets want this. */
		increment = 0;
		bUpdating = false;
	}
	else
	{
		stage = newstage + 1;

		if (volume == offset[newstage])
		{
			return Recompute(v);
		}
		target = offset[newstage];
		increment = rate[newstage];
		if (target < volume)
			increment = -increment;
	}

	return 0;
}